

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O3

ArchKind llvm::AArch64::parseArch(StringRef Arch)

{
  int iVar1;
  size_t in_RDX;
  ulong __n;
  long lVar2;
  StringRef SVar3;
  
  SVar3.Data = (char *)Arch.Length;
  SVar3.Length = in_RDX;
  SVar3 = ARM::getCanonicalArchName((ARM *)Arch.Data,SVar3);
  if (((1 < SVar3.Length) && (*SVar3.Data == 'v')) && (0xfffffffd < (int)SVar3.Data[1] - 0x3aU)) {
    SVar3 = getArchSynonym(SVar3);
    __n = SVar3.Length;
    lVar2 = 0;
    do {
      if ((__n <= *(ulong *)(&DAT_001e2f58 + lVar2)) &&
         ((__n == 0 ||
          (iVar1 = bcmp((void *)((*(ulong *)(&DAT_001e2f58 + lVar2) +
                                 *(long *)((long)&(anonymous_namespace)::AArch64ARCHNames + lVar2))
                                - __n),SVar3.Data,__n), iVar1 == 0)))) {
        return *(ArchKind *)((long)&DAT_001e2f88 + lVar2);
      }
      lVar2 = lVar2 + 0x40;
    } while (lVar2 != 0x180);
  }
  return INVALID;
}

Assistant:

StringRef llvm::AArch64::getCanonicalArchName(StringRef Arch) {
  return ARM::getCanonicalArchName(Arch);
}